

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode Curl_ssl_setup_x509_store(Curl_cfilter *cf,Curl_easy *data,SSL_CTX *ssl_ctx)

{
  byte bVar1;
  curl_blob *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  ssl_primary_config *psVar8;
  ssl_config_data *psVar9;
  timediff_t tVar10;
  X509_STORE *pXVar11;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  multi_ssl_backend_data *pmVar12;
  char *pcVar13;
  BIO *bp;
  stack_st_X509_INFO *psVar14;
  undefined8 *puVar15;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  Curl_multi *pCVar19;
  int iVar20;
  CURLcode CVar21;
  curltime cVar22;
  curltime cVar23;
  curltime older;
  byte local_72;
  
  psVar8 = Curl_ssl_cf_get_primary_config(cf);
  psVar9 = Curl_ssl_cf_get_config(cf,data);
  local_72 = 1;
  if (((((data->set).general_ssl.ca_cache_timeout != 0) && ((psVar8->field_0x69 & 1) != 0)) &&
      (psVar8->CApath == (char *)0x0)) &&
     ((psVar8->ca_info_blob == (curl_blob *)0x0 && ((psVar9->primary).CRLfile == (char *)0x0)))) {
    local_72 = (psVar9->field_0xb0 & 0x40) >> 6;
  }
  pCVar19 = data->multi_easy;
  if (((pCVar19 != (Curl_multi *)0x0) || (pCVar19 = data->multi, pCVar19 != (Curl_multi *)0x0)) &&
     ((pmVar12 = pCVar19->ssl_backend_data, pmVar12 != (multi_ssl_backend_data *)0x0 &&
      (pmVar12->store != (X509_STORE *)0x0)))) {
    cVar22 = Curl_now();
    uVar4 = (pmVar12->time).tv_sec;
    uVar5 = (pmVar12->time).tv_usec;
    older.tv_usec = uVar5;
    older.tv_sec = uVar4;
    cVar23._12_4_ = 0;
    cVar23.tv_sec = SUB128(cVar22._0_12_,0);
    cVar23.tv_usec = SUB124(cVar22._0_12_,8);
    older._12_4_ = 0;
    tVar10 = Curl_timediff(cVar23,older);
    lVar16 = (long)(data->set).general_ssl.ca_cache_timeout;
    if ((lVar16 < 0) || (SBORROW8(tVar10,lVar16 * 1000) != tVar10 + lVar16 * -1000 < 0)) {
      pmVar12 = pCVar19->ssl_backend_data;
      psVar8 = Curl_ssl_cf_get_primary_config(cf);
      pcVar13 = pmVar12->CAfile;
      pcVar3 = psVar8->CAfile;
      if (pcVar13 == (char *)0x0) {
        if (pcVar3 == (char *)0x0) {
LAB_006ab585:
          pXVar11 = (X509_STORE *)pCVar19->ssl_backend_data->store;
          if ((pXVar11 != (X509_STORE *)0x0 && local_72 == 0) &&
             (iVar6 = X509_STORE_up_ref(pXVar11), iVar6 != 0)) {
            SSL_CTX_set_cert_store((SSL_CTX *)ssl_ctx,pXVar11);
            return CURLE_OK;
          }
        }
      }
      else if ((pcVar3 != (char *)0x0) && (iVar6 = strcmp(pcVar13,pcVar3), iVar6 == 0))
      goto LAB_006ab585;
    }
  }
  pXVar11 = SSL_CTX_get_cert_store((SSL_CTX *)ssl_ctx);
  psVar8 = Curl_ssl_cf_get_primary_config(cf);
  psVar9 = Curl_ssl_cf_get_config(cf,data);
  pcVar2 = psVar8->ca_info_blob;
  if (pcVar2 == (curl_blob *)0x0) {
    pcVar13 = psVar8->CAfile;
  }
  else {
    pcVar13 = (char *)0x0;
  }
  pcVar3 = psVar8->CApath;
  pcVar18 = (psVar9->primary).CRLfile;
  bVar1 = psVar8->field_0x69;
  if (((cf != (Curl_cfilter *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
     (0 < cf->cft->log_level)) {
    pcVar17 = "none";
    if (pcVar13 != (char *)0x0) {
      pcVar17 = pcVar13;
    }
    Curl_trc_cf_infof(data,cf,"populate_x509_store, path=%s, blob=%d",pcVar17,
                      (ulong)(pcVar2 != (curl_blob *)0x0));
  }
  if (pXVar11 == (X509_STORE *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  if ((bVar1 & 1) != 0) {
    if (pcVar2 != (curl_blob *)0x0) {
      CVar21 = CURLE_SSL_CACERT_BADFILE;
      if (0x7fffffff < pcVar2->len) {
LAB_006ab637:
        Curl_failf(data,"error importing CA certificate blob");
        return CVar21;
      }
      bp = BIO_new_mem_buf(pcVar2->data,(int)pcVar2->len);
      if (bp == (BIO *)0x0) {
        CVar21 = CURLE_OUT_OF_MEMORY;
        goto LAB_006ab637;
      }
      psVar14 = PEM_X509_INFO_read_bio(bp,(stack_st_X509_INFO *)0x0,(undefined1 *)0x0,(void *)0x0);
      if (psVar14 == (stack_st_X509_INFO *)0x0) {
        BIO_free(bp);
        goto LAB_006ab637;
      }
      iVar6 = OPENSSL_sk_num(psVar14);
      CVar21 = CURLE_SSL_CACERT_BADFILE;
      if (0 < iVar6) {
        iVar6 = 0;
        iVar20 = 0;
        do {
          puVar15 = (undefined8 *)OPENSSL_sk_value(psVar14,iVar20);
          if ((X509 *)*puVar15 != (X509 *)0x0) {
            iVar7 = X509_STORE_add_cert(pXVar11,(X509 *)*puVar15);
            if (iVar7 != 0) {
              iVar6 = iVar6 + 1;
              goto LAB_006ab4de;
            }
LAB_006ab60c:
            CVar21 = CURLE_SSL_CACERT_BADFILE;
            goto LAB_006ab617;
          }
LAB_006ab4de:
          if ((X509_CRL *)puVar15[1] != (X509_CRL *)0x0) {
            iVar7 = X509_STORE_add_crl(pXVar11,(X509_CRL *)puVar15[1]);
            if (iVar7 == 0) goto LAB_006ab60c;
            iVar6 = iVar6 + 1;
          }
          iVar20 = iVar20 + 1;
          iVar7 = OPENSSL_sk_num(psVar14);
        } while (iVar20 < iVar7);
        CVar21 = CURLE_SSL_CACERT_BADFILE;
        if (0 < iVar6) {
          CVar21 = CURLE_OK;
        }
      }
LAB_006ab617:
      OPENSSL_sk_pop_free(psVar14,X509_INFO_free);
      BIO_free(bp);
      if (CVar21 != CURLE_OK) goto LAB_006ab637;
      if (((data->set).field_0x8bd & 0x10) != 0) {
        Curl_infof(data,"successfully imported CA certificate blob");
      }
    }
    if (pcVar13 == (char *)0x0 && pcVar3 == (char *)0x0) goto LAB_006ab2b3;
    if ((pcVar13 != (char *)0x0) && (iVar6 = X509_STORE_load_file(pXVar11,pcVar13), iVar6 == 0)) {
      if (pcVar2 == (curl_blob *)0x0) {
        pcVar18 = "error setting certificate file: %s";
        goto LAB_006ab7d4;
      }
      if (((data->set).field_0x8bd & 0x10) != 0) {
        Curl_infof(data,"error setting certificate file, continuing anyway");
      }
    }
    if ((pcVar3 != (char *)0x0) && (iVar6 = X509_STORE_load_path(pXVar11,pcVar3), iVar6 == 0)) {
      if (pcVar2 == (curl_blob *)0x0) {
        pcVar18 = "error setting certificate path: %s";
        pcVar13 = pcVar3;
LAB_006ab7d4:
        Curl_failf(data,pcVar18,pcVar13);
        return CURLE_SSL_CACERT_BADFILE;
      }
      if (((data->set).field_0x8bd & 0x10) != 0) {
        Curl_infof(data,"error setting certificate path, continuing anyway");
      }
    }
    if (((data->set).field_0x8bd & 0x10) != 0) {
      if (pcVar13 == (char *)0x0) {
        pcVar13 = "none";
      }
      Curl_infof(data," CAfile: %s",pcVar13);
      if (((data->set).field_0x8bd & 0x10) != 0) {
        pcVar13 = "none";
        if (pcVar3 != (char *)0x0) {
          pcVar13 = pcVar3;
        }
        Curl_infof(data," CApath: %s",pcVar13);
      }
    }
  }
LAB_006ab2b3:
  if (pcVar18 != (char *)0x0) {
    m = X509_LOOKUP_file();
    ctx = X509_STORE_add_lookup(pXVar11,m);
    if ((ctx == (X509_LOOKUP *)0x0) || (iVar6 = X509_load_crl_file(ctx,pcVar18,1), iVar6 == 0)) {
      Curl_failf(data,"error loading CRL file: %s",pcVar18);
      return CURLE_SSL_CRL_BADFILE;
    }
    if (((data->set).field_0x8bd & 0x10) != 0) {
      Curl_infof(data,"successfully loaded CRL file:");
    }
    X509_STORE_set_flags(pXVar11,0xc);
    if (((data->set).field_0x8bd & 0x10) != 0) {
      Curl_infof(data,"  CRLfile: %s",pcVar18);
    }
  }
  if ((((bVar1 & 1) != 0) && (X509_STORE_set_flags(pXVar11,0x8000), pcVar18 == (char *)0x0)) &&
     ((psVar9->field_0xb0 & 0x10) == 0)) {
    X509_STORE_set_flags(pXVar11,0x80000);
  }
  if (local_72 == 0) {
    psVar8 = Curl_ssl_cf_get_primary_config(cf);
    pCVar19 = data->multi_easy;
    if ((pCVar19 != (Curl_multi *)0x0) || (pCVar19 = data->multi, pCVar19 != (Curl_multi *)0x0)) {
      pmVar12 = pCVar19->ssl_backend_data;
      if (pmVar12 == (multi_ssl_backend_data *)0x0) {
        pmVar12 = (multi_ssl_backend_data *)(*Curl_ccalloc)(1,0x20);
        pCVar19->ssl_backend_data = pmVar12;
        if (pmVar12 == (multi_ssl_backend_data *)0x0) {
          return CURLE_OK;
        }
      }
      iVar6 = X509_STORE_up_ref(pXVar11);
      if (iVar6 == 0) {
        return CURLE_OK;
      }
      if (psVar8->CAfile == (char *)0x0) {
        pcVar13 = (char *)0x0;
      }
      else {
        pcVar13 = (*Curl_cstrdup)(psVar8->CAfile);
        if (pcVar13 == (char *)0x0) {
          X509_STORE_free(pXVar11);
          return CURLE_OK;
        }
      }
      if ((X509_STORE *)pmVar12->store != (X509_STORE *)0x0) {
        X509_STORE_free((X509_STORE *)pmVar12->store);
        (*Curl_cfree)(pmVar12->CAfile);
      }
      cVar23 = Curl_now();
      (pmVar12->time).tv_sec = cVar23.tv_sec;
      (pmVar12->time).tv_usec = cVar23.tv_usec;
      pmVar12->store = (X509_STORE *)pXVar11;
      pmVar12->CAfile = pcVar13;
    }
    return CURLE_OK;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_ssl_setup_x509_store(struct Curl_cfilter *cf,
                                   struct Curl_easy *data,
                                   SSL_CTX *ssl_ctx)
{
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct ssl_config_data *ssl_config = Curl_ssl_cf_get_config(cf, data);
  CURLcode result = CURLE_OK;
  X509_STORE *cached_store;
  bool cache_criteria_met;

  /* Consider the X509 store cacheable if it comes exclusively from a CAfile,
     or no source is provided and we are falling back to openssl's built-in
     default. */
  cache_criteria_met = (data->set.general_ssl.ca_cache_timeout != 0) &&
    conn_config->verifypeer &&
    !conn_config->CApath &&
    !conn_config->ca_info_blob &&
    !ssl_config->primary.CRLfile &&
    !ssl_config->native_ca_store;

  cached_store = get_cached_x509_store(cf, data);
  if(cached_store && cache_criteria_met && X509_STORE_up_ref(cached_store)) {
    SSL_CTX_set_cert_store(ssl_ctx, cached_store);
  }
  else {
    X509_STORE *store = SSL_CTX_get_cert_store(ssl_ctx);

    result = populate_x509_store(cf, data, store);
    if(result == CURLE_OK && cache_criteria_met) {
      set_cached_x509_store(cf, data, store);
    }
  }

  return result;
}